

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.cpp
# Opt level: O0

void f_luaopen(lua_State *L,void *ud)

{
  global_State *pgVar1;
  global_State *pgVar2;
  GCObject *pGVar3;
  TString *pTVar4;
  TValue *i_o_1;
  TValue *i_o;
  global_State *g;
  void *ud_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  stack_init(L,L);
  pGVar3 = (GCObject *)luaH_new(L,0,2);
  (L->l_gt).value.gc = pGVar3;
  (L->l_gt).tt = 5;
  pgVar2 = L->l_G;
  pGVar3 = (GCObject *)luaH_new(L,0,2);
  (pgVar2->l_registry).value.gc = pGVar3;
  (pgVar2->l_registry).tt = 5;
  luaS_resize(L,0x20);
  luaT_init(L);
  luaX_init(L);
  pTVar4 = luaS_newlstr(L,"not enough memory",0x11);
  (pTVar4->tsv).marked = (pTVar4->tsv).marked | 0x20;
  pgVar1->GCthreshold = pgVar1->totalbytes << 2;
  return;
}

Assistant:

static void f_luaopen (lua_State *L, void *ud) {
  global_State *g = G(L);
  UNUSED(ud);
  stack_init(L, L);  /* init stack */
  sethvalue(L, gt(L), luaH_new(L, 0, 2));  /* table of globals */
  sethvalue(L, registry(L), luaH_new(L, 0, 2));  /* registry */
  luaS_resize(L, MINSTRTABSIZE);  /* initial size of string table */
  luaT_init(L);
  luaX_init(L);
  luaS_fix(luaS_newliteral(L, MEMERRMSG));
  g->GCthreshold = 4*g->totalbytes;
}